

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apdu.c
# Opt level: O1

bool_t apduRespIsValid(apdu_resp_t *resp)

{
  bool_t bVar1;
  uint uVar2;
  
  bVar1 = memIsValid(resp,0x10);
  uVar2 = 0;
  if ((bVar1 != 0) && (resp->rdf_len < 0x10001)) {
    bVar1 = memIsValid(resp + 1,resp->rdf_len);
    uVar2 = (uint)(bVar1 != 0);
  }
  return uVar2;
}

Assistant:

bool_t apduRespIsValid(const apdu_resp_t* resp)
{
	return memIsValid(resp, sizeof(apdu_resp_t)) &&
		resp->rdf_len <= 65536 &&
		memIsValid(resp->rdf, resp->rdf_len);
}